

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_crypto_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *end;
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  quicly_stream_t *stream;
  quicly_stream_frame_t frame;
  quicly_stream_frame_t local_48;
  
  end = state->end;
  local_48.stream_id = 0;
  local_48._8_1_ = local_48._8_1_ & 0xfe;
  local_48.offset = ptls_decode_quicint(&state->src,end);
  iVar3 = 0x20007;
  if (local_48.offset != 0xffffffffffffffff) {
    uVar4 = ptls_decode_quicint(&state->src,end);
    if (uVar4 != 0xffffffffffffffff) {
      puVar1 = state->src;
      bVar2 = false;
      if (uVar4 <= (ulong)((long)end - (long)puVar1)) {
        state->src = puVar1 + uVar4;
        bVar2 = true;
        iVar3 = 0;
        local_48.data.base = puVar1;
        local_48.data.len = uVar4;
      }
      goto LAB_00132f60;
    }
  }
  bVar2 = false;
LAB_00132f60:
  if (bVar2) {
    stream = quicly_get_stream(conn,~state->epoch);
    if (stream == (quicly_stream_t *)0x0) {
      __assert_fail("stream != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x124e,
                    "int handle_crypto_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                   );
    }
    iVar3 = apply_stream_frame(stream,&local_48);
  }
  return iVar3;
}

Assistant:

static int handle_crypto_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_stream_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_crypto_frame(&state->src, state->end, &frame)) != 0)
        return ret;
    stream = quicly_get_stream(conn, -(quicly_stream_id_t)(1 + state->epoch));
    assert(stream != NULL);
    return apply_stream_frame(stream, &frame);
}